

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_lmb.cpp
# Opt level: O0

UChar GetUniFromLMBCSUni(char **ppLMBCSin)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  byte *pbVar4;
  undefined2 local_12;
  uint8_t LowCh;
  uint8_t HighCh;
  char **ppLMBCSin_local;
  
  pcVar3 = *ppLMBCSin;
  *ppLMBCSin = pcVar3 + 1;
  cVar1 = *pcVar3;
  pbVar4 = (byte *)*ppLMBCSin;
  *ppLMBCSin = (char *)(pbVar4 + 1);
  bVar2 = *pbVar4;
  local_12 = CONCAT11(cVar1,bVar2);
  if (cVar1 == -10) {
    local_12 = (ushort)bVar2 << 8;
  }
  return local_12;
}

Assistant:

static UChar
GetUniFromLMBCSUni(char const ** ppLMBCSin)  /* Called with LMBCS-style Unicode byte stream */
{
   uint8_t  HighCh = *(*ppLMBCSin)++;  /* Big-endian Unicode in LMBCS compatibility group*/
   uint8_t  LowCh  = *(*ppLMBCSin)++;

   if (HighCh == ULMBCS_UNICOMPATZERO ) 
   {
      HighCh = LowCh;
      LowCh = 0; /* zero-byte in LSB special character */
   }
   return (UChar)((HighCh << 8) | LowCh);
}